

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

expr_node * __thiscall expr_tree::mulDeriv(expr_tree *this,expr_node *node)

{
  expr_node *peVar1;
  expr_node *peVar2;
  expr_node *peVar3;
  expr_node *deriv;
  expr_node *in_stack_ffffffffffffff98;
  expr_value local_40;
  expr_value local_38 [3];
  expr_value local_20;
  expr_node *local_18;
  
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_20,1);
  expr_node::expr_node(peVar1,'\x05',&local_20);
  local_18 = peVar1;
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)local_38,3);
  peVar2 = derivative(this,node);
  peVar3 = Copy(in_stack_ffffffffffffff98);
  expr_node::expr_node(peVar1,'\x05',local_38,(expr_node *)0x0,peVar2,peVar3);
  local_18->left = peVar1;
  peVar1 = local_18->left;
  Link(peVar1,peVar1->left,peVar1->right);
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_40,3);
  peVar2 = Copy(peVar3);
  peVar3 = derivative(this,node);
  expr_node::expr_node(peVar1,'\x05',&local_40,(expr_node *)0x0,peVar2,peVar3);
  local_18->right = peVar1;
  Link(local_18->right,local_18->right->left,local_18->right->right);
  Link(local_18,local_18->left,local_18->right);
  return local_18;
}

Assistant:

expr_node* expr_tree::mulDeriv(const expr_node* node)
{
    auto deriv = new expr_node(OP, (long)ADD);
    deriv->left = new expr_node(OP, (long)MUL, nullptr, derivative(node->left), Copy(node->right));
    Link(deriv->left, deriv->left->left, deriv->left->right);
    deriv->right = new expr_node(OP, (long)MUL, nullptr, Copy(node->left), derivative(node->right));
    Link(deriv->right, deriv->right->left, deriv->right->right);
    Link(deriv, deriv->left, deriv->right);
    return deriv;
}